

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

string * common_sampler_prev_str_abi_cxx11_(common_sampler *gsmpl,llama_context *ctx_main,int n)

{
  size_t sVar1;
  int *piVar2;
  undefined8 uVar3;
  long in_RSI;
  string *in_RDI;
  llama_token id;
  int i;
  string *result;
  string *ctx;
  ring_buffer<int> *in_stack_ffffffffffffffa0;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar4;
  allocator<char> local_21;
  int local_20;
  int local_1c [7];
  
  ctx = in_RDI;
  sVar1 = ring_buffer<int>::size((ring_buffer<int> *)(in_RSI + 0x130));
  local_20 = (int)sVar1;
  piVar2 = std::min<int>(local_1c,&local_20);
  local_1c[0] = *piVar2;
  if (local_1c[0] < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
    std::__cxx11::string::reserve((ulong)in_RDI);
    iVar4 = local_1c[0];
    while (iVar4 = iVar4 + -1, -1 < iVar4) {
      piVar2 = ring_buffer<int>::rat(in_stack_ffffffffffffffa0,(size_t)ctx);
      if (*piVar2 == -1) {
        uVar3 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
                           ,0x1d0,"GGML_ASSERT(%s) failed",
                           "id != LLAMA_TOKEN_NULL && \"null token in the sampling history - should not happen\""
                          );
        std::__cxx11::string::~string((string *)in_RDI);
        _Unwind_Resume(uVar3);
      }
      common_token_to_piece_abi_cxx11_
                ((llama_context *)ctx,(llama_token)((ulong)in_RDI >> 0x20),
                 SUB81((ulong)in_RDI >> 0x18,0));
      std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xffffffffffffffa0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    }
  }
  return ctx;
}

Assistant:

std::string common_sampler_prev_str(common_sampler * gsmpl, llama_context * ctx_main, int n) {
    n = std::min(n, (int) gsmpl->prev.size());

    if (n <= 0) {
        return "";
    }

    std::string result;
    result.reserve(8*n); // 8 is the average length of a token [citation needed], TODO: compute this from the vocab

    for (int i = n - 1; i >= 0; i--) {
        const llama_token id = gsmpl->prev.rat(i);

        GGML_ASSERT(id != LLAMA_TOKEN_NULL && "null token in the sampling history - should not happen");

        result += common_token_to_piece(ctx_main, id);
    }

    return result;
}